

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  TransformerLogLin *pTVar5;
  ImPlotPlot *pIVar6;
  ImDrawVert *pIVar7;
  uint *puVar8;
  ImPlotPoint IVar24;
  ImVec2 IVar9;
  double dVar10;
  ImVec2 IVar11;
  ImPlotContext *pIVar12;
  uint uVar13;
  float fVar14;
  undefined4 in_XMM1_Da;
  float fVar15;
  float fVar16;
  undefined4 in_XMM1_Db;
  undefined4 uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pTVar5 = this->Transformer;
  IVar24.x = (*this->Getter1->Getter)(this->Getter1->Data,prim + 1);
  pIVar12 = GImPlot;
  dVar10 = log10((double)IVar24.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar6 = pIVar12->CurrentPlot;
  dVar3 = (pIVar6->XAxis).Range.Min;
  iVar4 = pTVar5->YAxis;
  uVar17 = 0;
  fVar15 = (float)((((double)(float)(dVar10 / pIVar12->LogDenX) *
                     ((pIVar6->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar12->Mx +
                  (double)pIVar12->PixelRange[iVar4].Min.x);
  fVar18 = (float)(((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - pIVar6->YAxis[iVar4].Range.Min) *
                   pIVar12->My[iVar4] + (double)pIVar12->PixelRange[iVar4].Min.y);
  pTVar5 = this->Transformer;
  fVar16 = fVar15;
  IVar24.x = (*this->Getter2->Getter)(this->Getter2->Data,prim + 1);
  pIVar12 = GImPlot;
  dVar10 = log10((double)IVar24.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar6 = pIVar12->CurrentPlot;
  dVar3 = (pIVar6->XAxis).Range.Min;
  iVar4 = pTVar5->YAxis;
  fVar14 = (float)((((double)(float)(dVar10 / pIVar12->LogDenX) *
                     ((pIVar6->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar12->Mx +
                  (double)pIVar12->PixelRange[iVar4].Min.x);
  fVar20 = (float)(((double)CONCAT44(uVar17,fVar16) - pIVar6->YAxis[iVar4].Range.Min) *
                   pIVar12->My[iVar4] + (double)pIVar12->PixelRange[iVar4].Min.y);
  fVar16 = (this->P12).x;
  fVar19 = fVar16 - fVar14;
  fVar22 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar23 = fVar22 * fVar18 - fVar15 * fVar1;
  fVar16 = fVar16 * fVar20 - fVar14 * fVar2;
  fVar22 = fVar22 - fVar15;
  fVar21 = fVar22 * (fVar2 - fVar20) - fVar19 * (fVar1 - fVar18);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar7 = DrawList->_VtxWritePtr;
  pIVar7->col = this->Col;
  pIVar7[1].pos.x = fVar15;
  pIVar7[1].pos.y = fVar18;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar7 = DrawList->_VtxWritePtr;
  pIVar7[1].col = this->Col;
  IVar11.y = ((fVar2 - fVar20) * fVar23 - (fVar1 - fVar18) * fVar16) / fVar21;
  IVar11.x = (fVar23 * fVar19 - fVar22 * fVar16) / fVar21;
  pIVar7[2].pos = IVar11;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar7 = DrawList->_VtxWritePtr;
  pIVar7[2].col = this->Col;
  pIVar7[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar7 = DrawList->_VtxWritePtr;
  pIVar7[3].col = this->Col;
  IVar9.y = fVar20;
  IVar9.x = fVar14;
  pIVar7[4].pos = IVar9;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar7 = DrawList->_VtxWritePtr;
  pIVar7[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar7 + 5;
  puVar8 = DrawList->_IdxWritePtr;
  *puVar8 = DrawList->_VtxCurrentIdx;
  uVar13 = -(uint)(fVar2 < fVar1 && fVar18 < fVar20 || fVar1 < fVar2 && fVar20 < fVar18) & 1;
  puVar8[1] = DrawList->_VtxCurrentIdx + uVar13 + 1;
  puVar8[2] = DrawList->_VtxCurrentIdx + 3;
  puVar8[3] = DrawList->_VtxCurrentIdx + 1;
  puVar8[4] = (uVar13 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar8[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar8 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar15;
  (this->P11).y = fVar18;
  (this->P12).x = fVar14;
  (this->P12).y = fVar20;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }